

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

bool __thiscall OpenMD::MoleculeStamp::addTorsionStamp(MoleculeStamp *this,TorsionStamp *torsion)

{
  value_type *in_RDI;
  vector<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return true;
}

Assistant:

bool MoleculeStamp::addTorsionStamp(TorsionStamp* torsion) {
    torsionStamps_.push_back(torsion);
    return true;
  }